

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_token.cpp
# Opt level: O1

bool __thiscall
CNetTokenManager::CheckToken
          (CNetTokenManager *this,NETADDR *pAddr,TOKEN Token,TOKEN ResponseToken,
          bool *BroadcastResponse)

{
  TOKEN TVar1;
  bool bVar2;
  
  TVar1 = GenerateToken(pAddr,this->m_Seed);
  bVar2 = true;
  if (TVar1 != Token) {
    TVar1 = GenerateToken(pAddr,this->m_PrevSeed);
    if (TVar1 != Token) {
      if ((this->m_GlobalToken == Token) || (this->m_PrevGlobalToken == Token)) {
        *BroadcastResponse = true;
      }
      else {
        bVar2 = false;
      }
    }
  }
  return bVar2;
}

Assistant:

bool CNetTokenManager::CheckToken(const NETADDR *pAddr, TOKEN Token, TOKEN ResponseToken, bool *BroadcastResponse)
{
	TOKEN CurrentToken = GenerateToken(pAddr, m_Seed);
	if(CurrentToken == Token)
		return true;

	if(GenerateToken(pAddr, m_PrevSeed) == Token)
	{
		// no need to notify the peer, just a one time thing
		return true;
	}
	else if(Token == m_GlobalToken)
	{
		*BroadcastResponse = true;
		return true;
	}
	else if(Token == m_PrevGlobalToken)
	{
		// no need to notify the peer, just a broadcast token response
		*BroadcastResponse = true;
		return true;
	}

	return false;
}